

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_retcode PDHG_Create(CUPDLPwork **ww,CUPDLPproblem *lp,CUPDLPscaling *scaling)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  CUPDLPwork *w;
  cupdlp_retcode retcode;
  uint local_1c;
  
  pvVar3 = calloc(1,0x60);
  *in_RDI = (long)pvVar3;
  lVar1 = *in_RDI;
  if (lVar1 != 0) {
    puVar2 = (undefined8 *)*in_RDI;
    *puVar2 = in_RSI;
    puVar2[5] = in_RDX;
  }
  local_1c = (uint)(lVar1 == 0);
  return local_1c;
}

Assistant:

cupdlp_retcode PDHG_Create(CUPDLPwork **ww, CUPDLPproblem *lp,
                           CUPDLPscaling *scaling) {
  cupdlp_retcode retcode = RETCODE_OK;
  CUPDLP_INIT_ZERO_CUPDLP_WORK(*ww, 1);

  CUPDLPwork *w = *ww;
  w->problem = lp;
  w->scaling = scaling;

exit_cleanup:
  return retcode;
}